

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# allphone_search.c
# Opt level: O0

void allphone_search_free(ps_search_t *search)

{
  int iVar1;
  long lVar2;
  double dVar3;
  double n_speech;
  allphone_search_t *allphs;
  ps_search_t *search_local;
  
  iVar1 = *(int *)&search[1].hyp_str;
  lVar2 = ps_config_int(search->config,"frate");
  dVar3 = (double)iVar1 / (double)lVar2;
  err_msg(ERR_INFO,
          "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/allphone_search.c"
          ,0x289,"TOTAL allphone %.2f CPU %.3f xRT\n",search[2].type,(double)search[2].type / dVar3)
  ;
  err_msg(ERR_INFO,
          "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/allphone_search.c"
          ,0x28c,"TOTAL allphone %.2f wall %.3f xRT\n",search[2].name,(double)search[2].name / dVar3
         );
  ps_search_base_free(search);
  allphone_clear_segments((allphone_search_t *)search);
  hmm_context_free((hmm_context_t *)search[1].vt);
  phmm_free((allphone_search_t *)search);
  if (search[1].type != (char *)0x0) {
    ngram_model_free((ngram_model_t *)search[1].type);
  }
  if (search[1].config != (cmd_ln_t *)0x0) {
    ckd_free(search[1].config);
  }
  if (search[1].last_link != (ps_latlink_t *)0x0) {
    blkarray_list_free((blkarray_list_t *)search[1].last_link);
  }
  ckd_free(search);
  return;
}

Assistant:

void
allphone_search_free(ps_search_t * search)
{
    allphone_search_t *allphs = (allphone_search_t *) search;

    
    double n_speech = (double)allphs->n_tot_frame
            / ps_config_int(ps_search_config(allphs), "frate");

    E_INFO("TOTAL allphone %.2f CPU %.3f xRT\n",
           allphs->perf.t_tot_cpu,
           allphs->perf.t_tot_cpu / n_speech);
    E_INFO("TOTAL allphone %.2f wall %.3f xRT\n",
           allphs->perf.t_tot_elapsed,
           allphs->perf.t_tot_elapsed / n_speech);

    ps_search_base_free(search);

    allphone_clear_segments(allphs);
    hmm_context_free(allphs->hmmctx);
    phmm_free(allphs);
    if (allphs->lm)
        ngram_model_free(allphs->lm);
    if (allphs->ci2lmwid)
        ckd_free(allphs->ci2lmwid);
    if (allphs->history)
        blkarray_list_free(allphs->history);

    ckd_free(allphs);
}